

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O0

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  char *in_RCX;
  long in_RDX;
  char *in_RSI;
  int in_EDI;
  char *in_R8;
  int found_prog_name;
  int i;
  int option_index;
  int optopt;
  int opterr;
  int optind;
  char *optarg;
  int check_ambiguity;
  int check_required;
  int initialize;
  int override;
  gengetopt_args_info local_args_info;
  int error_occurred;
  int c;
  char *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe94;
  char *local_138;
  int local_11c;
  int local_114;
  int local_110;
  int local_10c;
  char *local_108;
  char **in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  uint *in_stack_ffffffffffffff70;
  uint *in_stack_ffffffffffffff78;
  char **in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  cmdline_parser_arg_type in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int no_free;
  char short_opt;
  
  no_free = 0;
  package_name = *(char **)in_RSI;
  uVar1 = *(undefined4 *)(in_RCX + 0xc);
  local_138 = in_R8;
  if (*(int *)(in_RCX + 4) != 0) {
    cmdline_parser_init((gengetopt_args_info *)0x1446ac);
    local_138 = in_R8;
  }
  cmdline_parser_init((gengetopt_args_info *)0x1446b9);
  local_108 = (char *)0x0;
  local_10c = 0;
  local_110 = *(int *)(in_RCX + 0x10);
  local_114 = 0x3f;
  do {
    while( true ) {
      custom_optarg = local_108;
      custom_optind = local_10c;
      custom_opterr = local_110;
      custom_optopt = local_114;
      uVar2 = custom_getopt_long(in_stack_fffffffffffffe94,
                                 (char **)CONCAT44(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88),
                                 (char *)CONCAT44(in_stack_fffffffffffffe84,
                                                  in_stack_fffffffffffffe80),
                                 (option *)in_stack_fffffffffffffe78,(int *)0x144740);
      iVar3 = custom_optind;
      local_108 = custom_optarg;
      local_10c = custom_optind;
      local_110 = custom_opterr;
      local_114 = custom_optopt;
      if (uVar2 == 0xffffffff) {
        cmdline_parser_release
                  ((gengetopt_args_info *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        if (no_free != 0) {
          return 1;
        }
        if (iVar3 < in_EDI) {
          local_11c = 0;
          *(int *)(in_RDX + 0xa8) = in_EDI - iVar3;
          pvVar4 = malloc((ulong)*(uint *)(in_RDX + 0xa8) << 3);
          *(void **)(in_RDX + 0xa0) = pvVar4;
          while (local_10c < in_EDI) {
            local_10c = local_10c + 1;
            pcVar5 = gengetopt_strdup(in_stack_fffffffffffffe78);
            *(char **)(*(long *)(in_RDX + 0xa0) + (long)local_11c * 8) = pcVar5;
            local_11c = local_11c + 1;
          }
        }
        return 0;
      }
      if ((uVar2 == 0) || (uVar2 == 0x3f)) goto LAB_00144d16;
      if (uVar2 == 0x56) {
        cmdline_parser_print_version();
        cmdline_parser_free((gengetopt_args_info *)0x144832);
        exit(0);
      }
      iVar3 = (int)local_138;
      short_opt = (char)in_RDX;
      in_stack_fffffffffffffe88 = uVar1;
      if (uVar2 != 0x62) break;
      in_stack_fffffffffffffe78 = (char *)0x0;
      in_stack_fffffffffffffe80 = 1;
      iVar3 = update_arg(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,no_free,iVar3,in_RCX,
                         short_opt,in_RSI);
      if (iVar3 != 0) goto LAB_00144d16;
    }
    if (uVar2 == 100) {
      in_stack_fffffffffffffe78 = (char *)0x0;
      in_stack_fffffffffffffe80 = 4;
      iVar3 = update_arg(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,no_free,iVar3,in_RCX,
                         short_opt,in_RSI);
    }
    else {
      if (uVar2 == 0x68) {
        cmdline_parser_print_help();
        cmdline_parser_free((gengetopt_args_info *)0x144819);
        exit(0);
      }
      if (uVar2 == 0x69) {
        in_stack_fffffffffffffe78 = (char *)0x0;
        in_stack_fffffffffffffe80 = 2;
        iVar3 = update_arg(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,no_free,iVar3,in_RCX,
                           short_opt,in_RSI);
      }
      else if (uVar2 == 0x6d) {
        in_stack_fffffffffffffe78 = (char *)0x0;
        in_stack_fffffffffffffe80 = 2;
        iVar3 = update_arg(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,no_free,iVar3,in_RCX,
                           short_opt,in_RSI);
      }
      else {
        if (uVar2 != 0x6e) {
          if (local_138 == (char *)0x0) {
            local_138 = "";
          }
          fprintf(_stderr,"%s: option unknown: %c%s\n","elasticConstants",(ulong)uVar2,local_138);
          abort();
        }
        in_stack_fffffffffffffe78 = "25";
        in_stack_fffffffffffffe80 = 3;
        iVar3 = update_arg(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,no_free,iVar3,in_RCX,
                           short_opt,in_RSI);
      }
    }
  } while (iVar3 == 0);
LAB_00144d16:
  cmdline_parser_release
            ((gengetopt_args_info *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  return 1;
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  FIX_UNUSED(check_required);
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "box",	0, NULL, 'b' },
        { "method",	1, NULL, 'm' },
        { "npoints",	1, NULL, 'n' },
        { "delta",	1, NULL, 'd' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:bm:n:d:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* Input file name.  */
        
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'b':	/* Optimize box geometry before performing calculation.  */
        
        
          if (update_arg((void *)&(args_info->box_flag), 0, &(args_info->box_given),
              &(local_args_info.box_given), optarg, 0, 0, ARG_FLAG,
              check_ambiguity, override, 1, 0, "box", 'b',
              additional_error))
            goto failure;
        
          break;
        case 'm':	/* Calculation Method.  */
        
        
          if (update_arg( (void *)&(args_info->method_arg), 
               &(args_info->method_orig), &(args_info->method_given),
              &(local_args_info.method_given), optarg, cmdline_parser_method_values, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "method", 'm',
              additional_error))
            goto failure;
        
          break;
        case 'n':	/* number of points for fitting
        stress-strain relationship.  */
        
        
          if (update_arg( (void *)&(args_info->npoints_arg), 
               &(args_info->npoints_orig), &(args_info->npoints_given),
              &(local_args_info.npoints_given), optarg, 0, "25", ARG_INT,
              check_ambiguity, override, 0, 0,
              "npoints", 'n',
              additional_error))
            goto failure;
        
          break;
        case 'd':	/* size of relative volume changes for strains.  */
        
        
          if (update_arg( (void *)&(args_info->delta_arg), 
               &(args_info->delta_orig), &(args_info->delta_given),
              &(local_args_info.delta_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "delta", 'd',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */




  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}